

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O2

void __thiscall OpenMD::IntegratorCreator::~IntegratorCreator(IntegratorCreator *this)

{
  this->_vptr_IntegratorCreator = (_func_int **)&PTR__IntegratorCreator_002bd610;
  std::__cxx11::string::~string((string *)&this->ident_);
  return;
}

Assistant:

virtual ~IntegratorCreator() = default;